

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

void testing::internal::
     GenerateNamesRecursively<testing::internal::DefaultNameGenerator,testing::internal::Types<char8_t>>
               (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *param_1)

{
  int in_stack_ffffffffffffffcc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  DefaultNameGenerator::GetName<char8_t>(in_stack_ffffffffffffffcc);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>(param_1,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void GenerateNamesRecursively(Types, std::vector<std::string>* result, int i) {
  result->push_back(NameGenerator::template GetName<typename Types::Head>(i));
  GenerateNamesRecursively<NameGenerator>(typename Types::Tail(), result,
                                          i + 1);
}